

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptor::DebugString
          (FieldDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options
          )

{
  char *pcVar1;
  FeatureSet *from;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  Descriptor *pDVar5;
  FieldDescriptor *pFVar6;
  OneofDescriptor *pOVar7;
  DescriptorNames *pDVar8;
  FeatureSet *this_00;
  FieldOptions *this_01;
  SourceLocationCommentPrinter *this_02;
  Arg *a0;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view src;
  Arg *in_stack_fffffffffffffd78;
  string formatted_options;
  string label;
  string field_type;
  string prefix;
  Arg local_1f0;
  FieldOptions full_options;
  SourceLocationCommentPrinter comment_printer;
  Arg local_90;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  field_type._M_dataplus._M_p = (pointer)&field_type.field_2;
  field_type._M_string_length = 0;
  field_type.field_2._M_local_buf[0] = '\0';
  bVar2 = is_map(this);
  if (bVar2) {
    pDVar5 = message_type(this);
    pFVar6 = Descriptor::field(pDVar5,0);
    FieldTypeNameDebugString_abi_cxx11_(&formatted_options,pFVar6);
    pDVar5 = message_type(this);
    pFVar6 = Descriptor::field(pDVar5,1);
    FieldTypeNameDebugString_abi_cxx11_((string *)&local_1f0,pFVar6);
    format._M_str = "map<$0, $1>";
    format._M_len = 0xb;
    absl::lts_20250127::SubstituteAndAppend
              (&field_type,format,(Arg *)&comment_printer,(Arg *)&full_options);
    std::__cxx11::string::~string((string *)&local_1f0);
    this_02 = (SourceLocationCommentPrinter *)&formatted_options;
  }
  else {
    FieldTypeNameDebugString_abi_cxx11_((string *)&comment_printer,this);
    this_02 = &comment_printer;
    std::__cxx11::string::operator=((string *)&field_type,(string *)this_02);
  }
  std::__cxx11::string::~string((string *)this_02);
  comment_printer._0_16_ =
       absl::lts_20250127::NullSafeStringView
                 (*(Nullable<const_char_*> *)
                   (kLabelToName + (ulong)((byte)this->field_0x1 >> 6) * 8));
  full_options.super_Message.super_MessageLite =
       (MessageLite)absl::lts_20250127::NullSafeStringView(" ");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&label,(lts_20250127 *)&comment_printer,(AlphaNum *)&full_options,
             (AlphaNum *)&full_options);
  bVar2 = is_map(this);
  if (((bVar2) || (pOVar7 = real_containing_oneof(this), pOVar7 != (OneofDescriptor *)0x0)) ||
     (((this->merged_features_->field_0)._impl_.field_presence_ != 3 &&
      ((bVar2 = is_repeated(this), !bVar2 && (bVar2 = has_optional_keyword(this), !bVar2)))))) {
    label._M_string_length = 0;
    *label._M_dataplus._M_p = '\0';
  }
  bVar2 = is_repeated(this);
  if ((!bVar2) && (999 < (int)this->file_->edition_)) {
    label._M_string_length = 0;
    *label._M_dataplus._M_p = '\0';
  }
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&prefix);
  if (debug_string_options->include_comments == true) {
    bVar2 = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    bVar2 = false;
  }
  comment_printer.have_source_loc_ = bVar2;
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
  full_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
       (intptr_t)prefix._M_dataplus._M_p;
  full_options.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)prefix._M_string_length;
  formatted_options._M_dataplus._M_p = (pointer)label._M_string_length;
  formatted_options._M_string_length = (size_type)label._M_dataplus._M_p;
  local_1f0.piece_._M_len = field_type._M_string_length;
  local_1f0.piece_._M_str = field_type._M_dataplus._M_p;
  if (((int)this->file_->edition_ < 1000) && (this->type_ == '\n')) {
    pDVar5 = message_type(this);
    pDVar8 = &pDVar5->all_names_;
  }
  else {
    pDVar8 = &this->all_names_;
  }
  local_90.piece_._M_len = (size_t)*(ushort *)pDVar8->payload_;
  local_90.piece_._M_str = (char *)((long)pDVar8->payload_ + ~local_90.piece_._M_len);
  this_01 = (FieldOptions *)&stack0xffffffffffffffa0;
  absl::lts_20250127::substitute_internal::Arg::Arg((Arg *)this_01,this->number_);
  a0 = (Arg *)&formatted_options;
  format_01._M_str = (char *)&full_options;
  format_01._M_len = (size_t)"$0$1$2 $3 = $4";
  absl::lts_20250127::SubstituteAndAppend
            ((lts_20250127 *)contents,(Nonnull<std::string_*>)0xe,format_01,a0,&local_1f0,&local_90,
             (Arg *)this_01,in_stack_fffffffffffffd78);
  bVar3 = this->field_0x1;
  bVar2 = (bVar3 & 1) != 0;
  if (bVar2) {
    DefaultValueAsString_abi_cxx11_(&formatted_options,this,true);
    this_01 = &full_options;
    full_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         (intptr_t)formatted_options._M_dataplus._M_p;
    full_options.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)formatted_options._M_string_length;
    format_00._M_str = " [default = $0";
    format_00._M_len = 0xe;
    absl::lts_20250127::SubstituteAndAppend(contents,format_00,(Arg *)this_01);
    std::__cxx11::string::~string((string *)&formatted_options);
    bVar3 = this->field_0x1;
  }
  if ((bVar3 & 4) != 0) {
    if (bVar2) {
      std::__cxx11::string::append((char *)contents);
    }
    else {
      std::__cxx11::string::append((char *)contents);
    }
    bVar2 = true;
    std::__cxx11::string::append((char *)contents);
    pcVar1 = (this->all_names_).payload_;
    src._M_len = (long)pcVar1 - (ulong)*(ushort *)(pcVar1 + 0xc);
    src._M_str = (char *)this_01;
    absl::lts_20250127::CEscape_abi_cxx11_
              ((string *)&full_options,(lts_20250127 *)(ulong)*(ushort *)(pcVar1 + 0xe),src);
    std::__cxx11::string::append((string *)contents);
    std::__cxx11::string::~string((string *)&full_options);
    std::__cxx11::string::append((char *)contents);
  }
  FieldOptions::FieldOptions(&full_options,this->options_);
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    this_00 = FieldOptions::mutable_features(&full_options);
    FeatureSet::CopyFrom(this_00,from);
  }
  if ((~this->field_0x3 & 6) != 0) {
    FieldOptions::set_ctype
              (&full_options,
               (byte)this->field_0x3 >> 1 &
               (FieldOptions_CType_STRING_PIECE|FieldOptions_CType_CORD));
  }
  formatted_options._M_dataplus._M_p = (pointer)&formatted_options.field_2;
  formatted_options._M_string_length = 0;
  formatted_options.field_2._M_local_buf[0] = '\0';
  bVar4 = anon_unknown_24::FormatBracketedOptions
                    ((anon_unknown_24 *)(ulong)(uint)depth,(int)&full_options,
                     (Message *)this->file_->pool_,(DescriptorPool *)&formatted_options,(string *)a0
                    );
  if (bVar4) {
    std::__cxx11::string::append((char *)contents);
    std::__cxx11::string::append((string *)contents);
  }
  else if (!bVar2) goto LAB_0013262e;
  std::__cxx11::string::append((char *)contents);
LAB_0013262e:
  if ((((int)this->file_->edition_ < 1000) && (this->type_ == '\n')) &&
     (debug_string_options->elide_group_body == false)) {
    pDVar5 = message_type(this);
    Descriptor::DebugString(pDVar5,depth,contents,debug_string_options,false);
  }
  else {
    std::__cxx11::string::append((char *)contents);
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
  std::__cxx11::string::~string((string *)&formatted_options);
  FieldOptions::~FieldOptions(&full_options);
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
  std::__cxx11::string::~string((string *)&label);
  std::__cxx11::string::~string((string *)&field_type);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void FieldDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  std::string field_type;

  // Special case map fields.
  if (is_map()) {
    absl::SubstituteAndAppend(
        &field_type, "map<$0, $1>",
        message_type()->field(0)->FieldTypeNameDebugString(),
        message_type()->field(1)->FieldTypeNameDebugString());
  } else {
    field_type = FieldTypeNameDebugString();
  }

  std::string label =
      absl::StrCat(kLabelToName[static_cast<Label>(label_)], " ");

  // Label is omitted for maps, oneof, and plain proto3 fields.
  if (is_map() || real_containing_oneof() ||
      (!is_required() && !is_repeated() && !has_optional_keyword())) {
    label.clear();
  }
  // Label is omitted for optional and required fields under editions.
  if (!is_repeated() && !IsLegacyEdition(file()->edition())) {
    label.clear();
  }

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  absl::SubstituteAndAppend(
      contents, "$0$1$2 $3 = $4", prefix, label, field_type,
      IsGroupSyntax(file()->edition(), this) ? message_type()->name() : name(),
      number());

  bool bracketed = false;
  if (has_default_value()) {
    bracketed = true;
    absl::SubstituteAndAppend(contents, " [default = $0",
                              DefaultValueAsString(true));
  }
  if (has_json_name_) {
    if (!bracketed) {
      bracketed = true;
      contents->append(" [");
    } else {
      contents->append(", ");
    }
    contents->append("json_name = \"");
    contents->append(absl::CEscape(json_name()));
    contents->append("\"");
  }

  FieldOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  if (has_legacy_proto_ctype()) {
    full_options.set_ctype(
        static_cast<FieldOptions::CType>(legacy_proto_ctype()));
  }
  std::string formatted_options;
  if (FormatBracketedOptions(depth, full_options, file()->pool(),
                             &formatted_options)) {
    contents->append(bracketed ? ", " : " [");
    bracketed = true;
    contents->append(formatted_options);
  }

  if (bracketed) {
    contents->append("]");
  }

  if (IsGroupSyntax(file()->edition(), this)) {
    if (debug_string_options.elide_group_body) {
      contents->append(" { ... };\n");
    } else {
      message_type()->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ false);
    }
  } else {
    contents->append(";\n");
  }

  comment_printer.AddPostComment(contents);
}